

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_sort.cpp
# Opt level: O0

test_call_type *
dispatch_parameters<unsigned_long>
          (test_call_type *__return_storage_ptr__,string *statistic,string *prepare_type)

{
  function<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_(std::vector<unsigned_long,_std::allocator<unsigned_long>_>)>
  local_b0;
  function<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_(std::vector<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>)>
  local_90;
  undefined1 local_60 [8];
  prepare_function_for_t<unsigned_long> prepare_funcion;
  statistic_function_for_t<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  statistic_function;
  string *prepare_type_local;
  string *statistic_local;
  
  statistic_for<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
            ((statistic_function_for_t<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> *
             )&prepare_funcion._M_invoker,statistic);
  prepare_for<unsigned_long>((prepare_function_for_t<unsigned_long> *)local_60,prepare_type);
  std::
  function<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_(std::vector<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>)>
  ::function(&local_90,
             (function<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_(std::vector<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>)>
              *)&prepare_funcion._M_invoker);
  std::
  function<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_(std::vector<unsigned_long,_std::allocator<unsigned_long>_>)>
  ::function(&local_b0,
             (function<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_(std::vector<unsigned_long,_std::allocator<unsigned_long>_>)>
              *)local_60);
  make_test_all<unsigned_long,std::function<std::chrono::duration<long,std::ratio<1l,1000000000l>>(std::vector<std::chrono::duration<long,std::ratio<1l,1000000000l>>,std::allocator<std::chrono::duration<long,std::ratio<1l,1000000000l>>>>)>,std::function<std::vector<unsigned_long,std::allocator<unsigned_long>>(std::vector<unsigned_long,std::allocator<unsigned_long>>)>>
            (__return_storage_ptr__,&local_90,&local_b0);
  std::
  function<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_(std::vector<unsigned_long,_std::allocator<unsigned_long>_>)>
  ::~function(&local_b0);
  std::
  function<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_(std::vector<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>)>
  ::~function(&local_90);
  std::
  function<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_(std::vector<unsigned_long,_std::allocator<unsigned_long>_>)>
  ::~function((function<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_(std::vector<unsigned_long,_std::allocator<unsigned_long>_>)>
               *)local_60);
  std::
  function<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_(std::vector<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>)>
  ::~function((function<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_(std::vector<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>)>
               *)&prepare_funcion._M_invoker);
  return __return_storage_ptr__;
}

Assistant:

test_call_type dispatch_parameters (const std::string & statistic, const std::string & prepare_type)
{
    auto statistic_function = statistic_for<clock_type::duration>(statistic);
    auto prepare_funcion = prepare_for<Value>(prepare_type);

    return make_test_all<Value>(statistic_function, prepare_funcion);
}